

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

HookAction spy_param_test::fooHookEnter(void *targetFunc,void *callbackParam,size_t frameBase)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  size_t in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double r;
  int q;
  int o;
  int m;
  VaList va;
  double p;
  double n;
  double l;
  double j;
  double h;
  double f;
  double d;
  double b;
  int k;
  int i;
  int g;
  int e;
  int c;
  int a;
  RegArgBlock *regArgBlock;
  VaList local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  undefined8 *local_28;
  size_t local_20;
  
  local_20 = in_RDX;
  printf("+foo(func: %p, param: %p):\n",in_RDI,in_RSI);
  local_28 = (undefined8 *)(local_20 - 0xb0);
  local_2c = (uint)*local_28;
  local_30 = (uint)*(undefined8 *)(local_20 - 0xa8);
  local_34 = (uint)*(undefined8 *)(local_20 - 0xa0);
  local_38 = (uint)*(undefined8 *)(local_20 - 0x98);
  local_3c = (uint)*(undefined8 *)(local_20 - 0x90);
  local_40 = (undefined4)*(undefined8 *)(local_20 - 0x88);
  local_48 = *(undefined8 *)(local_20 - 0x80);
  local_50 = *(undefined8 *)(local_20 - 0x70);
  local_58 = *(undefined8 *)(local_20 - 0x60);
  local_60 = *(undefined8 *)(local_20 - 0x50);
  local_68 = *(undefined8 *)(local_20 - 0x40);
  local_70 = *(undefined8 *)(local_20 - 0x30);
  local_78 = *(undefined8 *)(local_20 - 0x20);
  local_80 = *(undefined8 *)(local_20 - 0x10);
  axl::spy::vaStart(&local_88,local_20);
  piVar4 = axl::spy::vaArg<int>(&local_88);
  iVar1 = *piVar4;
  piVar4 = axl::spy::vaArg<int>(&local_88);
  iVar2 = *piVar4;
  piVar4 = axl::spy::vaArg<int>(&local_88);
  iVar3 = *piVar4;
  pdVar5 = axl::spy::vaArg<double>(&local_88);
  printf("  (%d, %f, %d, %f, %d, %f, %d, %f, %d, %f, %d, %f, %d, %f, %d, %f, %d, %f)\n",local_48,
         local_50,local_58,local_60,local_68,local_70,local_78,local_80,(ulong)local_2c,
         (ulong)local_30,(ulong)local_34,(ulong)local_38,(ulong)local_3c,local_40,iVar1,iVar2,iVar3,
         *pdVar5);
  return HookAction_Default;
}

Assistant:

spy::HookAction
fooHookEnter(
	void* targetFunc,
	void* callbackParam,
	size_t frameBase
) {
	printf(
		"+foo(func: %p, param: %p):\n",
		targetFunc,
		callbackParam
	);

#if (_AXL_CPU_AMD64)
#	if (_AXL_CPP_MSC)
	spy::RegArgBlock* regArgBlock = (spy::RegArgBlock*)(frameBase + spy::FrameOffset_RegArgBlock);

	int a    = (int)regArgBlock->m_rcx;
	double b = regArgBlock->m_xmm1[0];
	int c    = (int)regArgBlock->m_r8;
	double d = regArgBlock->m_xmm3[0];

	spy::VaList va;
	spy::vaStart(va, frameBase);

	int e = spy::vaArg<int>(va);
	double f = spy::vaArg<double>(va);
	int g = spy::vaArg<int>(va);
	double h = spy::vaArg<double>(va);
	int i = spy::vaArg<int>(va);
	double j = spy::vaArg<double>(va);
	int k = spy::vaArg<int>(va);
	double l = spy::vaArg<double>(va);
	int m = spy::vaArg<int>(va);
	double n = spy::vaArg<double>(va);
	int o = spy::vaArg<int>(va);
	double p = spy::vaArg<double>(va);
	int q = spy::vaArg<int>(va);
	double r = spy::vaArg<double>(va);

#	elif (_AXL_CPP_GCC)
	spy::RegArgBlock* regArgBlock = (spy::RegArgBlock*)(frameBase + spy::FrameOffset_RegArgBlock);

	int a = (int)regArgBlock->m_rdi;
	int c = (int)regArgBlock->m_rsi;
	int e = (int)regArgBlock->m_rdx;
	int g = (int)regArgBlock->m_rcx;
	int i = (int)regArgBlock->m_r8;
	int k = (int)regArgBlock->m_r9;
	double b = regArgBlock->m_xmm0[0];
	double d = regArgBlock->m_xmm1[0];
	double f = regArgBlock->m_xmm2[0];
	double h = regArgBlock->m_xmm3[0];
	double j = regArgBlock->m_xmm4[0];
	double l = regArgBlock->m_xmm5[0];
	double n = regArgBlock->m_xmm6[0];
	double p = regArgBlock->m_xmm7[0];

	spy::VaList va;
	spy::vaStart(va, frameBase);

	int m = spy::vaArg<int>(va);
	int o = spy::vaArg<int>(va);
	int q = spy::vaArg<int>(va);
	double r = spy::vaArg<double>(va);

#	endif
#elif (_AXL_CPU_X86)
	spy::VaList va;
	spy::vaStart(va, frameBase);

	int a = spy::vaArg<int>(va);
	double b = spy::vaArg<double>(va);
	int c = spy::vaArg<int>(va);
	double d = spy::vaArg<double>(va);
	int e = spy::vaArg<int>(va);
	double f = spy::vaArg<double>(va);
	int g = spy::vaArg<int>(va);
	double h = spy::vaArg<double>(va);
	int i = spy::vaArg<int>(va);
	double j = spy::vaArg<double>(va);
	int k = spy::vaArg<int>(va);
	double l = spy::vaArg<double>(va);
	int m = spy::vaArg<int>(va);
	double n = spy::vaArg<double>(va);
	int o = spy::vaArg<int>(va);
	double p = spy::vaArg<double>(va);
	int q = spy::vaArg<int>(va);
	double r = spy::vaArg<double>(va);

#endif

	printf(
		"  ("
		"%d, %f, %d, %f, %d, %f, "
		"%d, %f, %d, %f, %d, %f, "
		"%d, %f, %d, %f, %d, %f)\n",
		a, b, c, d, e, f,
		g, h, i, j, k, l,
		m, n, o, p, q, r
	);

	return spy::HookAction_Default;
}